

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O3

char * guess_plot_filext(char *filepath,char *filext)

{
  char cVar1;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  
  if (filext == (char *)0x0) {
    sVar2 = strlen(filepath);
    uVar3 = sVar2 & 0xffffffff;
    filext = (char *)0x0;
    do {
      uVar3 = uVar3 - 1;
      if ((int)(uint)uVar3 < 0) goto LAB_001060ff;
      uVar5 = (ulong)((uint)uVar3 & 0x7fffffff);
      cVar1 = filepath[uVar5];
      if ((cVar1 == '\\') || (cVar1 == '/')) goto LAB_001060ff;
    } while (cVar1 != '.');
    filext = filepath + uVar5 + 1;
  }
LAB_001060ff:
  pcVar4 = "pdf";
  if (filext != (char *)0x0) {
    pcVar4 = filext;
  }
  return pcVar4;
}

Assistant:

const char *guess_plot_filext(const char *filepath, const char *filext) {
    if (filext == NULL) {
        for (int32_t i = strlen(filepath) - 1; i >= 0; i--) {
            if (filepath[i] == '/' || filepath[i] == '\\') {
                break;
            } else if (filepath[i] == '.') {
                filext = filepath + i + 1;
                break;
            }
        }
    }

    // Default the file extension to pdf if none is specified and if we cannot
    // autodetect
    filext = filext != NULL ? filext : "pdf";
    return filext;
}